

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void dashedSet(gdImagePtr im,int x,int y,int color,int *onP,int *dashStepP,int wid,int vert)

{
  int iVar1;
  undefined4 local_3c;
  int wstart;
  int w;
  int on;
  int dashStep;
  int *dashStepP_local;
  int *onP_local;
  int color_local;
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  wstart = *onP;
  w = *dashStepP + 1;
  if (w == 4) {
    w = 0;
    wstart = (int)((wstart != 0 ^ 0xffU) & 1);
  }
  if (wstart != 0) {
    if (vert == 0) {
      iVar1 = x - wid / 2;
      for (local_3c = iVar1; local_3c < iVar1 + wid; local_3c = local_3c + 1) {
        gdImageSetPixel(im,local_3c,y,color);
      }
    }
    else {
      iVar1 = y - wid / 2;
      for (local_3c = iVar1; local_3c < iVar1 + wid; local_3c = local_3c + 1) {
        gdImageSetPixel(im,x,local_3c,color);
      }
    }
  }
  *dashStepP = w;
  *onP = wstart;
  return;
}

Assistant:

static void
dashedSet (gdImagePtr im, int x, int y, int color,
		   int *onP, int *dashStepP, int wid, int vert)
{
	int dashStep = *dashStepP;
	int on = *onP;
	int w, wstart;

	dashStep++;
	if (dashStep == gdDashSize) {
		dashStep = 0;
		on = !on;
	}
	if (on) {
		if (vert) {
			wstart = y - wid / 2;
			for (w = wstart; w < wstart + wid; w++)
				gdImageSetPixel (im, x, w, color);
		} else {
			wstart = x - wid / 2;
			for (w = wstart; w < wstart + wid; w++)
				gdImageSetPixel (im, w, y, color);
		}
	}
	*dashStepP = dashStep;
	*onP = on;
}